

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderIncompleteGSTest::getGeometryShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderIncompleteGSTest *this,_run *current_run)

{
  stringstream gs_code_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\n",0x27);
  if (current_run->is_input_primitive_type_defined == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"layout(points) in;\n",0x13);
  }
  if ((current_run->is_max_vertices_defined != false) ||
     (current_run->is_output_primitive_type_defined == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"layout(",7);
    if (current_run->is_max_vertices_defined == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"max_vertices = 1",0x10);
      if (current_run->is_output_primitive_type_defined == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
      }
    }
    if (current_run->is_output_primitive_type_defined == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"points",6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,") out;\n",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n    EmitVertex();\n}\n",
             0x4b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderIncompleteGSTest::getGeometryShaderCode(const _run& current_run)
{
	std::stringstream gs_code_sstream;

	gs_code_sstream << "${VERSION}\n"
					   "${GEOMETRY_SHADER_REQUIRE}\n"
					   "\n";

	if (current_run.is_input_primitive_type_defined)
	{
		gs_code_sstream << "layout(points) in;\n";
	}

	if (current_run.is_max_vertices_defined || current_run.is_output_primitive_type_defined)
	{
		gs_code_sstream << "layout(";

		if (current_run.is_max_vertices_defined)
		{
			gs_code_sstream << "max_vertices = 1";

			if (current_run.is_output_primitive_type_defined)
			{
				gs_code_sstream << ", ";
			}
		} /* if (current_run.is_max_vertices_defined) */

		if (current_run.is_output_primitive_type_defined)
		{
			gs_code_sstream << "points";
		}

		gs_code_sstream << ") out;\n";
	}

	gs_code_sstream << "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = gl_in[0].gl_Position;\n"
					   "    EmitVertex();\n"
					   "}\n";

	return gs_code_sstream.str();
}